

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

MPP_RET mpp_buf_slot_enqueue(MppBufSlots slots,RK_S32 index,SlotQueueType type)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  MPP_RET MVar6;
  AutoMutex auto_lock;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_enqueue");
    MVar6 = MPP_ERR_NULL_PTR;
  }
  else {
    auto_lock.mLock = *slots;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    if ((index < 0) || (*(int *)((long)slots + 0x60) <= index)) {
      _dump_slots("mpp_buf_slot_enqueue",(MppBufSlotsImpl *)slots);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(index >= 0) && (index < impl->buf_count)","mpp_buf_slot_enqueue",0x43d);
      abort();
    }
    lVar1 = *(long *)((long)slots + 0xe8);
    MVar6 = MPP_OK;
    slot_ops_with_log((MppBufSlotsImpl *)slots,
                      (MppBufSlotEntry *)(lVar1 + (ulong)(uint)index * 0x38),type + 0xf,(void *)0x0)
    ;
    lVar1 = lVar1 + (ulong)(uint)index * 0x38;
    plVar5 = (long *)(lVar1 + 8);
    lVar2 = *plVar5;
    plVar3 = *(long **)(lVar1 + 0x10);
    *(long **)(lVar2 + 8) = plVar3;
    *plVar3 = lVar2;
    *(long **)(lVar1 + 0x10) = plVar5;
    puVar4 = *(undefined8 **)((long)slots + (ulong)type * 0x10 + 0xa8);
    *(long **)((long)slots + (ulong)type * 0x10 + 0xa8) = plVar5;
    *plVar5 = (long)slots + (ulong)type * 0x10 + 0xa0;
    *(undefined8 **)(lVar1 + 0x10) = puVar4;
    *puVar4 = plVar5;
    Mutex::Autolock::~Autolock(&auto_lock);
  }
  return MVar6;
}

Assistant:

MPP_RET mpp_buf_slot_enqueue(MppBufSlots slots, RK_S32 index, SlotQueueType type)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, (index >= 0) && (index < impl->buf_count));
    MppBufSlotEntry *slot = &impl->slots[index];
    slot_ops_with_log(impl, slot, (MppBufSlotOps)(SLOT_ENQUEUE + type), NULL);

    // add slot to display list
    list_del_init(&slot->list);
    list_add_tail(&slot->list, &impl->queue[type]);
    return MPP_OK;
}